

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O1

void __thiscall AsyncLogging::threadFunc(AsyncLogging *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  element_type *peVar4;
  element_type *peVar5;
  const_iterator __cbeg;
  MutexLockGuard lock;
  shared_ptr<FixedBuffer<4000000>_> *buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  undefined1 local_b0 [8];
  LogFile output;
  FixedBuffer<4000000> *pFStack_58;
  BufferPtr newBuffer;
  BufferVector buffersToWrite;
  
  if (this->running_ == false) {
    __assert_fail("running_ == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                  ,0x23,"void AsyncLogging::threadFunc()");
  }
  CountDownLatch::countDown(&this->latch_);
  LogFile::LogFile((LogFile *)local_b0,&this->basename_,0x400);
  pFStack_58 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFStack_58->cur_ = (char *)pFStack_58;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newBuffer,pFStack_58);
  memset(pFStack_58,0,4000000);
  newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  buffersToWrite.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buffersToWrite.
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::reserve((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,0x10);
  output.file_._M_t.super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
  super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
  super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl =
       (__uniq_ptr_data<AppendFile,_std::default_delete<AppendFile>,_true,_true>)&this->buffers_;
  while( true ) {
    if (this->running_ != true) {
      LogFile::flush((LogFile *)local_b0);
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::~vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      LogFile::~LogFile((LogFile *)local_b0);
      return;
    }
    if ((pFStack_58 == (FixedBuffer<4000000> *)0x0) ||
       (*(int *)&pFStack_58->cur_ != (int)pFStack_58)) {
      __assert_fail("newBuffer && newBuffer->length() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                    ,0x2c,"void AsyncLogging::threadFunc()");
    }
    if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 buffersToWrite.
                 super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                    ,0x2d,"void AsyncLogging::threadFunc()");
    }
    pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    if ((this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->buffers_).
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Condition::waitForSeconds(&this->cond_,this->flushInterval_);
    }
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>
    ::emplace_back<std::shared_ptr<FixedBuffer<4000000>>>
              ((vector<std::shared_ptr<FixedBuffer<4000000>>,std::allocator<std::shared_ptr<FixedBuffer<4000000>>>>
                *)output.file_._M_t.
                  super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
                  super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
                  super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl,&this->currentBuffer_);
    peVar4 = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var1 = (this->currentBuffer_).
             super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pFStack_58;
    (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar3 = (this->buffers_).
             super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         buffersToWrite.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->buffers_).
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         buffersToWrite.
         super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == p_Var2) break;
    _Var6._M_pi = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (400 < (ulong)((long)p_Var2 -
                     (long)newBuffer.
                           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::_M_erase((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                  *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
                 (shared_ptr<FixedBuffer<4000000>_> *)
                 (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 2),
                 (shared_ptr<FixedBuffer<4000000>_> *)
                 (((long)p_Var2 -
                  (long)newBuffer.
                        super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi) +
                 (long)newBuffer.
                       super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi));
      _Var6 = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    }
    for (; _Var6._M_pi != p_Var2; _Var6._M_pi = _Var6._M_pi + 1) {
      peVar4 = ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
               &(_Var6._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
      LogFile::append((LogFile *)local_b0,peVar4->data_,*(int *)&peVar4->cur_ - (int)peVar4);
    }
    if (0x10 < (ulong)((long)p_Var2 -
                      (long)newBuffer.
                            super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)) {
      std::
      vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ::resize((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
                *)&newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,1);
    }
    peVar4 = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == p_Var2) {
      __assert_fail("!buffersToWrite.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                    ,0x47,"void AsyncLogging::threadFunc()");
    }
    pFStack_58 = ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
                 &p_Var2[-1]._vptr__Sp_counted_base)->_M_ptr;
    peVar5 = (element_type *)
             ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[-1]._M_use_count)->_M_pi;
    ((__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2> *)
    &p_Var2[-1]._vptr__Sp_counted_base)->_M_ptr = (element_type *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[-1]._M_use_count)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar8 = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0;
    newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    if (bVar8) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4);
    }
    buffersToWrite.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(p_Var2 + -1);
    p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var2[-1]._M_use_count)->_M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    _Var6._M_pi = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    pFStack_58->cur_ = pFStack_58->data_;
    _Var7._M_pi = newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        buffersToWrite.
        super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        newBuffer.super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi) {
      do {
        p_Var1 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Var7._M_pi)->_M_use_count)->_M_pi
        ;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        _Var7._M_pi = _Var7._M_pi + 1;
      } while (_Var7._M_pi !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               buffersToWrite.
               super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
      buffersToWrite.
      super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var6._M_pi;
    }
    LogFile::flush((LogFile *)local_b0);
    buffersToWrite.
    super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  }
  __assert_fail("!buffersToWrite.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,0x38,"void AsyncLogging::threadFunc()");
}

Assistant:

void AsyncLogging::threadFunc() {
    assert(running_ == true);
    latch_.countDown();
    LogFile output(basename_);
    BufferPtr newBuffer(new Buffer);
    newBuffer->bzero();
    BufferVector buffersToWrite;
    buffersToWrite.reserve(16);

    while (running_) {
        assert(newBuffer && newBuffer->length() == 0);
        assert(buffersToWrite.empty());
        {
            MutexLockGuard lock(mutex_);
            if(buffers_.empty()) {
                cond_.waitForSeconds(flushInterval_);
            }
            buffers_.push_back(std::move(currentBuffer_));
            currentBuffer_ = std::move(newBuffer);
            buffersToWrite.swap(buffers_);
        }
        
        assert(!buffersToWrite.empty());

        if (buffersToWrite.size() > 25) {
            buffersToWrite.erase(buffersToWrite.begin() + 2, buffersToWrite.end());
        }

        for (const auto& buffer : buffersToWrite) {
            output.append(buffer->data(), buffer->length());
        }

        if (buffersToWrite.size() > 1) {
            buffersToWrite.resize(1); 
        }

        if (!newBuffer) {
            assert(!buffersToWrite.empty());
            newBuffer = std::move(buffersToWrite.back());
            buffersToWrite.pop_back();
            newBuffer->reset();
        }

        buffersToWrite.clear();
        output.flush();
    }

    output.flush();
}